

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan_state.cpp
# Opt level: O1

bool __thiscall
duckdb::CollectionScanState::Scan
          (CollectionScanState *this,DuckTransaction *transaction,DataChunk *result)

{
  TransactionData transaction_00;
  bool bVar1;
  RowGroup *pRVar2;
  bool bVar3;
  TransactionData local_48;
  
  pRVar2 = this->row_group;
  if (pRVar2 == (RowGroup *)0x0) {
LAB_0061cd6b:
    bVar3 = false;
  }
  else {
    do {
      TransactionData::TransactionData(&local_48,transaction);
      transaction_00.transaction_id = local_48.transaction_id;
      transaction_00.transaction.ptr = local_48.transaction.ptr;
      transaction_00.start_time = local_48.start_time;
      RowGroup::TemplatedScan<(duckdb::TableScanType)0>(pRVar2,transaction_00,this,result);
      bVar3 = result->count != 0;
      if (bVar3) {
        return bVar3;
      }
      if (this->max_row <=
          (this->row_group->super_SegmentBase<duckdb::RowGroup>).count.
          super___atomic_base<unsigned_long>._M_i +
          (this->row_group->super_SegmentBase<duckdb::RowGroup>).start) {
        this->row_group = (RowGroup *)0x0;
        goto LAB_0061cd6b;
      }
      while( true ) {
        pRVar2 = SegmentTree<duckdb::RowGroup,_true>::GetNextSegment
                           (&this->row_groups->super_SegmentTree<duckdb::RowGroup,_true>,
                            this->row_group);
        this->row_group = pRVar2;
        if (pRVar2 == (RowGroup *)0x0) break;
        if (this->max_row <= (pRVar2->super_SegmentBase<duckdb::RowGroup>).start) {
          this->row_group = (RowGroup *)0x0;
          break;
        }
        bVar1 = RowGroup::InitializeScan(pRVar2,this);
        if ((bVar1) || (this->row_group == (RowGroup *)0x0)) break;
      }
      pRVar2 = this->row_group;
    } while (pRVar2 != (RowGroup *)0x0);
  }
  return bVar3;
}

Assistant:

bool CollectionScanState::Scan(DuckTransaction &transaction, DataChunk &result) {
	while (row_group) {
		row_group->Scan(transaction, *this, result);
		if (result.size() > 0) {
			return true;
		} else if (max_row <= row_group->start + row_group->count) {
			row_group = nullptr;
			return false;
		} else {
			do {
				row_group = row_groups->GetNextSegment(row_group);
				if (row_group) {
					if (row_group->start >= max_row) {
						row_group = nullptr;
						break;
					}
					bool scan_row_group = row_group->InitializeScan(*this);
					if (scan_row_group) {
						// scan this row group
						break;
					}
				}
			} while (row_group);
		}
	}
	return false;
}